

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int INT_EVclient_wait_for_shutdown(EVclient client)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  pthread_t pVar4;
  CManager in_RDI;
  timespec ts_1;
  timespec ts;
  CMConnection in_stack_ffffffffffffffa8;
  FILE *pFVar5;
  EVclient in_stack_ffffffffffffffb0;
  undefined4 local_30;
  int in_stack_ffffffffffffffd4;
  CManager in_stack_ffffffffffffffd8;
  __time_t local_20;
  undefined4 local_18;
  CMTraceType in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_RDI->transports[0x24] == (transport_entry_conflict)0x0) {
    iVar1 = CMtrace_init(in_RDI,in_stack_ffffffffffffffec);
    if (iVar1 == 0) goto LAB_00160ff7;
  }
  else if (CMtrace_val[0xd] == 0) goto LAB_00160ff7;
  if (CMtrace_PID != 0) {
    pFVar5 = (FILE *)in_RDI->transports[0x24];
    _Var2 = getpid();
    pVar4 = pthread_self();
    fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,(timespec *)&local_20);
    fprintf((FILE *)in_RDI->transports[0x24],"%lld.%.9ld - ",local_20,
            CONCAT44(in_stack_ffffffffffffffec,local_18));
  }
  fprintf((FILE *)in_RDI->transports[0x24],"Client %d wait for shutdown \n",
          (ulong)*(uint *)&in_RDI->in_formats);
LAB_00160ff7:
  fflush((FILE *)in_RDI->transports[0x24]);
  if (*(int *)&in_RDI->reg_formats == 0) {
    new_shutdown_condition(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    INT_CMCondition_wait(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    iVar1 = CMtrace_val[0xd];
    if (in_RDI->transports[0x24] == (transport_entry_conflict)0x0) {
      iVar1 = CMtrace_init(in_RDI,in_stack_ffffffffffffffec);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = (FILE *)in_RDI->transports[0x24];
        _Var2 = getpid();
        lVar3 = (long)_Var2;
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",lVar3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_30);
        fprintf((FILE *)in_RDI->transports[0x24],"%lld.%.9ld - ",
                CONCAT44(in_stack_ffffffffffffffd4,local_30),in_stack_ffffffffffffffd8);
      }
      fprintf((FILE *)in_RDI->transports[0x24],"Client %d wait for shutdown DONE! \n",
              (ulong)*(uint *)&in_RDI->in_formats);
    }
    fflush((FILE *)in_RDI->transports[0x24]);
    local_4 = in_RDI->CManager_ID;
  }
  else {
    local_4 = in_RDI->CManager_ID;
  }
  return local_4;
}

Assistant:

extern int 
INT_EVclient_wait_for_shutdown(EVclient client)
{
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d wait for shutdown \n", client->my_node_id);
    if (client->already_shutdown) return client->shutdown_value;
    INT_CMCondition_wait(client->cm, new_shutdown_condition(client, client->master_connection));
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d wait for shutdown DONE! \n", client->my_node_id);
    return client->shutdown_value;
}